

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O2

REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,char *geom_filename)

{
  REF_GEOM ref_geom;
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  REF_INT gref;
  REF_INT nedge;
  REF_GRID local_4e8;
  REF_GEOM local_4e0;
  REF_INT new_cell;
  REF_INT ntri;
  FILE *local_4d0;
  undefined8 local_4c8;
  REF_INT local_4c0;
  REF_INT local_4bc;
  REF_DBL param [2];
  REF_INT edges [2];
  char line [1024];
  
  local_4e0 = ref_grid->geom;
  param[0] = 0.0;
  param[1] = 0.0;
  if (geom_filename != (char *)0x0) {
    local_4e8 = ref_grid;
    printf("parsing %s\n");
    __stream = fopen(geom_filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",geom_filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
             0x7c,"ref_meshlink_parse","unable to open file");
      return 2;
    }
    while (iVar1 = feof(__stream), iVar1 == 0) {
      iVar1 = __isoc99_fscanf(__stream,"%s",line);
      if (iVar1 != 1) {
        if (iVar1 != -1) {
          lVar4 = (long)iVar1;
          pcVar9 = "line read failed";
          uVar7 = 1;
          uVar6 = 0x80;
          goto LAB_0019291f;
        }
        break;
      }
      iVar1 = bcmp("sheet",line,6);
      if (iVar1 == 0) {
        iVar1 = __isoc99_fscanf(__stream,"%d %d",&ntri,&gref);
        if (iVar1 != 2) {
          lVar4 = (long)iVar1;
          pcVar9 = "sheet size gref";
          uVar7 = 2;
          uVar6 = 0x83;
          goto LAB_0019291f;
        }
        printf("sheet ntri %d gref %d\n",(ulong)(uint)ntri,(ulong)(uint)gref);
        iVar1 = -1;
        while (iVar1 = iVar1 + 1, iVar1 < ntri) {
          iVar2 = __isoc99_fscanf(__stream,"%d %d %d",&local_4c8,(long)&local_4c8 + 4,&local_4c0);
          if (iVar2 != 3) {
            lVar4 = (long)iVar2;
            pcVar9 = "tri nodes";
            uVar7 = 3;
            uVar6 = 0x87;
            goto LAB_0019291f;
          }
          local_4c8 = CONCAT44((int)((ulong)local_4c8 >> 0x20) + -1,(int)local_4c8 + -1);
          local_4c0 = local_4c0 + -1;
          local_4bc = gref;
          uVar3 = ref_cell_with(local_4e8->cell[3],(REF_INT *)&local_4c8,&new_cell);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "tri for sheet missing";
            uVar7 = 0x8d;
            goto LAB_001928bb;
          }
          local_4e8->cell[3]->c2n[(long)new_cell * (long)local_4e8->cell[3]->size_per + 3] =
               local_4bc;
          uVar3 = ref_geom_add(local_4e0,(REF_INT)local_4c8,2,local_4bc,param);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "face uv";
            uVar7 = 0x90;
            goto LAB_001928bb;
          }
          uVar3 = ref_geom_add(local_4e0,local_4c8._4_4_,2,local_4bc,param);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "face uv";
            uVar7 = 0x92;
            goto LAB_001928bb;
          }
          uVar3 = ref_geom_add(local_4e0,local_4c0,2,local_4bc,param);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "face uv";
            uVar7 = 0x94;
            goto LAB_001928bb;
          }
        }
      }
      iVar1 = bcmp("string",line,7);
      if (iVar1 == 0) {
        iVar1 = __isoc99_fscanf(__stream,"%d %d",&nedge,&gref);
        if (iVar1 != 2) {
          lVar4 = (long)iVar1;
          pcVar9 = "string size gref";
          uVar7 = 2;
          uVar6 = 0x99;
LAB_0019291f:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,uVar6,"ref_meshlink_parse",pcVar9,uVar7,lVar4);
          return 1;
        }
        printf("sheet ntri %d gref %d\n",(ulong)(uint)nedge,(ulong)(uint)gref);
        iVar1 = -1;
        local_4d0 = __stream;
        while( true ) {
          iVar1 = iVar1 + 1;
          __stream = local_4d0;
          if (nedge <= iVar1) break;
          iVar2 = __isoc99_fscanf(local_4d0,"%d %d",&local_4c8,(long)&local_4c8 + 4);
          if (iVar2 != 2) {
            lVar4 = (long)iVar2;
            pcVar9 = "edge nodes";
            uVar7 = 2;
            uVar6 = 0x9c;
            goto LAB_0019291f;
          }
          local_4c8 = CONCAT44((int)((ulong)local_4c8 >> 0x20) + -1,(int)local_4c8 + -1);
          local_4c0 = gref;
          uVar3 = ref_cell_add(local_4e8->cell[0],(REF_INT *)&local_4c8,&new_cell);
          ref_geom = local_4e0;
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "add edg for string";
            uVar7 = 0xa1;
            goto LAB_001928bb;
          }
          uVar3 = ref_geom_add(local_4e0,(REF_INT)local_4c8,1,local_4c0,param);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "edge t";
            uVar7 = 0xa3;
            goto LAB_001928bb;
          }
          uVar3 = ref_geom_add(ref_geom,local_4c8._4_4_,1,local_4c0,param);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "edge t";
            uVar7 = 0xa5;
            goto LAB_001928bb;
          }
        }
      }
    }
    fclose(__stream);
    for (lVar4 = 0; lVar4 < local_4e8->node->max; lVar4 = lVar4 + 1) {
      if (-1 < local_4e8->node->global[lVar4]) {
        uVar3 = ref_cell_id_list_around(local_4e8->cell[0],(REF_INT)lVar4,2,&nedge,edges);
        if ((uVar3 != 0) && (uVar3 != 7)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0xb2,"ref_meshlink_parse",(ulong)uVar3,"count edgeids");
          local_4d0 = (FILE *)CONCAT44(local_4d0._4_4_,uVar3);
        }
        if ((uVar3 != 7) && (uVar3 != 0)) {
          return (REF_STATUS)local_4d0;
        }
        if (1 < nedge) {
          lVar5 = -1;
          if ((lVar4 < local_4e8->node->max) && (lVar5 = local_4e8->node->global[lVar4], lVar5 < 0))
          {
            lVar5 = -1;
          }
          uVar3 = ref_geom_add(local_4e0,(REF_INT)lVar4,0,(REF_INT)lVar5,param);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "node";
            uVar7 = 0xb5;
LAB_001928bb:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                   ,uVar7,"ref_meshlink_parse",uVar8,pcVar9);
            return (REF_STATUS)uVar8;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_parse(REF_GRID ref_grid,
                                      const char *geom_filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *f = NULL;
  char line[1024];
  REF_INT tri, ntri, edge, nedge, gref, new_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  int status;
  REF_DBL param[2] = {0.0, 0.0};
  if (NULL == geom_filename) return REF_SUCCESS;
  printf("parsing %s\n", geom_filename);
  f = fopen(geom_filename, "r");
  if (NULL == (void *)f) printf("unable to open %s\n", geom_filename);
  RNS(f, "unable to open file");
  while (!feof(f)) {
    status = fscanf(f, "%s", line);
    if (EOF == status) break;
    REIS(1, status, "line read failed");

    if (0 == strcmp("sheet", line)) {
      REIS(2, fscanf(f, "%d %d", &ntri, &gref), "sheet size gref");
      printf("sheet ntri %d gref %d\n", ntri, gref);
      for (tri = 0; tri < ntri; tri++) {
        REIS(3, fscanf(f, "%d %d %d", &(nodes[0]), &(nodes[1]), &(nodes[2])),
             "tri nodes");
        (nodes[0])--;
        (nodes[1])--;
        (nodes[2])--;
        nodes[3] = gref;
        RSS(ref_cell_with(ref_grid_tri(ref_grid), nodes, &new_cell),
            "tri for sheet missing");
        ref_cell_c2n(ref_grid_tri(ref_grid), 3, new_cell) = nodes[3];
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_FACE, nodes[3], param),
            "face uv");
        RSS(ref_geom_add(ref_geom, nodes[2], REF_GEOM_FACE, nodes[3], param),
            "face uv");
      }
    }

    if (0 == strcmp("string", line)) {
      REIS(2, fscanf(f, "%d %d", &nedge, &gref), "string size gref");
      printf("sheet ntri %d gref %d\n", nedge, gref);
      for (edge = 0; edge < nedge; edge++) {
        REIS(2, fscanf(f, "%d %d", &(nodes[0]), &(nodes[1])), "edge nodes");
        (nodes[0])--;
        (nodes[1])--;
        nodes[2] = gref;
        RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
            "add edg for string");
        RSS(ref_geom_add(ref_geom, nodes[0], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
        RSS(ref_geom_add(ref_geom, nodes[1], REF_GEOM_EDGE, nodes[2], param),
            "edge t");
      }
    }
  }
  fclose(f);

  { /* mark cad nodes */
    REF_INT node;
    REF_INT edges[2];
    REF_INT id;
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      RXS(ref_cell_id_list_around(ref_grid_edg(ref_grid), node, 2, &nedge,
                                  edges),
          REF_INCREASE_LIMIT, "count edgeids");
      if (nedge > 1) {
        id = (REF_INT)ref_node_global(ref_grid_node(ref_grid), node);
        RSS(ref_geom_add(ref_geom, node, REF_GEOM_NODE, id, param), "node");
      }
    }
  }

  return REF_SUCCESS;
}